

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *local_28;
  char *dest_ptr;
  char *dest;
  char *src;
  FilePath *this_local;
  
  pcVar2 = String::c_str(&this->pathname_);
  if (pcVar2 == (char *)0x0) {
    String::operator=(&this->pathname_,"");
  }
  else {
    dest = String::c_str(&this->pathname_);
    sVar3 = String::length(&this->pathname_);
    pcVar2 = (char *)operator_new__(sVar3 + 1);
    sVar3 = String::length(&this->pathname_);
    memset(pcVar2,0,sVar3 + 1);
    local_28 = pcVar2;
    while (*dest != '\0') {
      *local_28 = *dest;
      bVar1 = IsPathSeparator(*dest);
      if (bVar1) {
        while (bVar1 = IsPathSeparator(*dest), bVar1) {
          dest = dest + 1;
        }
      }
      else {
        dest = dest + 1;
      }
      local_28 = local_28 + 1;
    }
    *local_28 = '\0';
    String::operator=(&this->pathname_,pcVar2);
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
  }
  return;
}

Assistant:

void FilePath::Normalize() {
  if (pathname_.c_str() == NULL) {
    pathname_ = "";
    return;
  }
  const char* src = pathname_.c_str();
  char* const dest = new char[pathname_.length() + 1];
  char* dest_ptr = dest;
  memset(dest_ptr, 0, pathname_.length() + 1);

  while (*src != '\0') {
    *dest_ptr = *src;
    if (!IsPathSeparator(*src)) {
      src++;
    } else {
#if GTEST_HAS_ALT_PATH_SEP_
      if (*dest_ptr == kAlternatePathSeparator) {
        *dest_ptr = kPathSeparator;
      }
#endif
      while (IsPathSeparator(*src))
        src++;
    }
    dest_ptr++;
  }
  *dest_ptr = '\0';
  pathname_ = dest;
  delete[] dest;
}